

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstToYaml.cpp
# Opt level: O0

void MyCompiler::Util::processAst<MyCompiler::ProcedureDeclaration>
               (ProcedureDeclaration *ast,int level,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *items,string *name)

{
  string *items_00;
  int level_00;
  element_type *ast_00;
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  string *local_28;
  string *name_local;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *items_local;
  ProcedureDeclaration *pPStack_10;
  int level_local;
  ProcedureDeclaration *ast_local;
  
  local_28 = name;
  name_local = (string *)items;
  items_local._4_4_ = level;
  pPStack_10 = ast;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"- ident: \"",&local_89);
  std::__shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &pPStack_10->pIdent);
  std::operator+(local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88);
  std::operator+(local_48,(char *)local_68);
  std::
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>::
  emplace_back<int&,std::__cxx11::string>
            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              *)items,(int *)((long)&items_local + 4),local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  ast_00 = std::__shared_ptr_access<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&pPStack_10->pBlock);
  items_00 = name_local;
  level_00 = items_local._4_4_ + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"block",&local_c1);
  processAst<MyCompiler::Block>
            (ast_00,level_00,
             (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)items_00,(string *)local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  return;
}

Assistant:

void MyCompiler::Util::processAst<MyCompiler::ProcedureDeclaration>(
        ProcedureDeclaration &ast, int level,
        std::vector<std::pair<int, std::string>> &items, const std::string &name)
{
    items.emplace_back(level, std::string("- ident: \"") + ast.pIdent->value + "\"");
    processAst(*ast.pBlock, level + 1, items, "block");
}